

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZContBufferedStream.cpp
# Opt level: O0

void __thiscall
TPZContBufferedStream::ConstReadFromBuffer(TPZContBufferedStream *this,char *dest,size_t *nBytes)

{
  ostream *this_00;
  ulong *in_RDX;
  void *in_RSI;
  long in_RDI;
  char *endBuffer;
  string msg;
  size_t in_stack_00000368;
  char *in_stack_00000370;
  string local_90 [16];
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_39;
  string local_38 [32];
  ulong *local_18;
  void *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (*(ulong *)(in_RDI + 0x28) < *in_RDX) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_39);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff88);
    std::__cxx11::string::append(local_38);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    std::__cxx11::string::append((char *)local_38);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff88);
    std::__cxx11::string::append(local_38);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::append((char *)local_38);
    this_00 = std::operator<<((ostream *)&std::cerr,local_38);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000370,in_stack_00000368);
    std::__cxx11::string::~string(local_38);
  }
  memcpy(local_10,*(void **)(in_RDI + 0x10),*local_18);
  return;
}

Assistant:

void TPZContBufferedStream::ConstReadFromBuffer(char *dest,
        const size_t &nBytes) const {
    if (nBytes > fSize) {
        std::string msg("TPZContBufferedStream: Cannot read ");
        msg.append(std::to_string(nBytes));
        msg.append(" bytes; there are only ");
        msg.append(std::to_string(fSize));
        msg.append(" available.");
        PZError << msg << std::endl;
        DebugStop();
    }
    char *endBuffer = fBuffer + fNAllocatedBytes;
    memcpy(dest, fFirst, nBytes);
}